

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

int EVdfg_perform_act_on_state(EVdfg_configuration config,EVdfg_config_action act,int build_queue)

{
  EVdfg_config_action act_00;
  EVdfg_config_action act_01;
  EVdfg_config_action act_02;
  EVdfg_config_action act_03;
  EVdfg_config_action act_04;
  EVdfg_config_action act_05;
  EVdfg_config_action act_06;
  EVdfg_config_action act_07;
  EVdfg_config_action act_08;
  EVdfg_config_action act_09;
  EVdfg_config_action act_10;
  EVdfg_config_action act_11;
  EVdfg_config_action act_12;
  EVdfg_config_action act_13;
  bool bVar1;
  EVdfg_stone_state p_Var2;
  EVdfg_stone_state *pp_Var3;
  char **ppcVar4;
  int *piVar5;
  EVdfg_stone_state p_Var6;
  EVdfg_stone_state p_Var7;
  ulong uVar8;
  int in_ESI;
  EVdfg_configuration in_RDI;
  undefined8 unaff_retaddr;
  uint in_stack_00000008;
  int iVar9;
  undefined1 in_stack_0000000c [20];
  EVdfg_stone_state stone_5;
  EVdfg_stone_state stone_4;
  EVdfg_stone_state stone_3;
  EVdfg_config_action dact_2;
  EVdfg_stone_state possible_bridge;
  int i_2;
  int found;
  EVdfg_stone_state dest_1;
  EVdfg_stone_state src_3;
  EVdfg_config_action dact_1;
  EVdfg_stone_state dest;
  EVdfg_stone_state src_2;
  int out_link_found;
  int in_link_found_1;
  int i_1;
  EVdfg_stone_state dst_1;
  EVdfg_stone_state src_1;
  EVdfg_config_action fact;
  EVdfg_config_action dact;
  int in_link_found;
  int i;
  EVdfg_stone_state dst;
  EVdfg_stone_state src;
  EVdfg_stone_state stone_2;
  EVdfg_stone_state stone_1;
  EVdfg_stone_state stone;
  int bridge;
  size_t in_stack_fffffffffffffe98;
  void *in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  undefined4 *puVar10;
  int local_f0;
  int local_ec;
  int local_9c;
  undefined4 uStack_7c;
  undefined8 local_70;
  int local_44;
  undefined8 in_stack_ffffffffffffffe0;
  int build_queue_00;
  int iVar11;
  
  build_queue_00 = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  puVar10 = &stack0x00000008;
  iVar11 = 0;
  uVar8 = (ulong)(in_stack_00000008 - 1);
  iVar9 = in_stack_0000000c._0_4_;
  switch(uVar8) {
  case 1:
    p_Var2 = find_stone_state(iVar9,in_RDI);
    if (p_Var2 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    if (p_Var2->action == (char *)0x0) {
      p_Var2->action = *(char **)(puVar10 + 4);
    }
    else {
      if (p_Var2->extra_actions == (char **)0x0) {
        ppcVar4 = (char **)INT_CMmalloc((size_t)in_stack_fffffffffffffea0);
        p_Var2->extra_actions = ppcVar4;
      }
      else {
        ppcVar4 = (char **)INT_CMrealloc(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        p_Var2->extra_actions = ppcVar4;
      }
      p_Var2->extra_actions[p_Var2->action_count + -1] = *(char **)(puVar10 + 4);
      p_Var2->action_count = p_Var2->action_count + 1;
      if (in_ESI != 0) {
        act_04.node_for_action = in_stack_fffffffffffffeb8;
        act_04._0_8_ = *(undefined8 *)(puVar10 + 6);
        act_04._12_4_ = in_stack_fffffffffffffebc;
        act_04.u.bridge.action = (char *)puVar10;
        act_04.u._8_8_ = uVar8;
        EVdfg_add_act_to_queue(*(EVdfg_configuration *)(puVar10 + 2),act_04);
      }
    }
    break;
  case 2:
    p_Var2 = find_stone_state(iVar9,in_RDI);
    if (p_Var2 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    p_Var2->period_secs = puVar10[4];
    p_Var2->period_usecs = puVar10[5];
    if (in_ESI != 0) {
      act_05.node_for_action = in_stack_fffffffffffffeb8;
      act_05._0_8_ = *(undefined8 *)(puVar10 + 6);
      act_05._12_4_ = in_stack_fffffffffffffebc;
      act_05.u.bridge.action = (char *)puVar10;
      act_05.u._8_8_ = uVar8;
      EVdfg_add_act_to_queue(*(EVdfg_configuration *)(puVar10 + 2),act_05);
    }
    break;
  case 3:
    p_Var2 = find_stone_state(iVar9,in_RDI);
    p_Var6 = find_stone_state(puVar10[5],in_RDI);
    if (p_Var2 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    if (p_Var2->out_count == 0) {
      piVar5 = (int *)INT_CMmalloc((size_t)in_stack_fffffffffffffea0);
      p_Var2->out_links = piVar5;
      memset(p_Var2->out_links,0,(long)(puVar10[4] + 1) << 2);
      p_Var2->out_count = puVar10[4] + 1;
    }
    else if (p_Var2->out_count < puVar10[4] + 1) {
      piVar5 = (int *)INT_CMrealloc(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      p_Var2->out_links = piVar5;
      memset(p_Var2->out_links + p_Var2->out_count,0xff,
             (long)((puVar10[4] + 1) - p_Var2->out_count) << 2);
      p_Var2->out_count = puVar10[4] + 1;
    }
    bVar1 = false;
    for (local_44 = 0; local_44 < p_Var6->in_count; local_44 = local_44 + 1) {
      if (p_Var6->in_links[local_44] == puVar10[1]) {
        bVar1 = true;
      }
    }
    if (!bVar1) {
      if (p_Var6->in_count == 0) {
        piVar5 = (int *)INT_CMmalloc((size_t)in_stack_fffffffffffffea0);
        p_Var6->in_links = piVar5;
        memset(p_Var6->in_links,0,4);
        p_Var6->in_count = 1;
      }
      else {
        piVar5 = (int *)INT_CMrealloc(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        p_Var6->in_links = piVar5;
        memset(p_Var6->in_links + p_Var6->in_count,0,
               (long)((p_Var6->in_count + 1) - p_Var6->in_count) << 2);
        p_Var6->in_count = p_Var6->in_count + 1;
      }
      p_Var6->in_links[p_Var6->in_count + -1] = puVar10[1];
    }
    if ((in_ESI != 0) && (p_Var2->out_links[(int)puVar10[4]] != -1)) {
      act_00.node_for_action = in_stack_00000008;
      act_00.type = (int)unaff_retaddr;
      act_00.stone_id = (int)((ulong)unaff_retaddr >> 0x20);
      act_00._12_20_ = in_stack_0000000c;
      EVdfg_perform_act_on_state((EVdfg_configuration)CONCAT44(in_ESI,iVar11),act_00,build_queue_00)
      ;
    }
    p_Var2->out_links[(int)puVar10[4]] = puVar10[5];
    if (in_ESI != 0) {
      if (p_Var2->condition == EVstone_Deployed) {
        act_06.node_for_action = in_stack_fffffffffffffeb8;
        act_06._0_8_ = local_70;
        act_06._12_4_ = in_stack_fffffffffffffebc;
        act_06.u.bridge.action = (char *)puVar10;
        act_06.u._8_8_ = uVar8;
        EVdfg_add_act_to_queue((EVdfg_configuration)CONCAT44(uStack_7c,p_Var2->node),act_06);
        p_Var2->condition = EVstone_Frozen;
      }
      act_07.node_for_action = in_stack_fffffffffffffeb8;
      act_07._0_8_ = *(undefined8 *)(puVar10 + 6);
      act_07._12_4_ = in_stack_fffffffffffffebc;
      act_07.u.bridge.action = (char *)puVar10;
      act_07.u._8_8_ = uVar8;
      EVdfg_add_act_to_queue(*(EVdfg_configuration *)(puVar10 + 2),act_07);
    }
    break;
  case 4:
    p_Var2 = find_stone_state(iVar9,in_RDI);
    p_Var6 = find_stone_state(puVar10[5],in_RDI);
    bVar1 = false;
    for (local_9c = 0; local_9c < p_Var2->out_count; local_9c = local_9c + 1) {
      if (p_Var2->out_links[local_9c] == puVar10[5]) {
        bVar1 = true;
      }
    }
    if (bVar1) {
      return 0;
    }
    if (p_Var2 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    if (p_Var2->out_count == 0) {
      piVar5 = (int *)INT_CMmalloc((size_t)in_stack_fffffffffffffea0);
      p_Var2->out_links = piVar5;
      memset(p_Var2->out_links,0,(long)(p_Var2->out_count + 1) << 2);
      p_Var2->out_count = p_Var2->out_count + 1;
    }
    else {
      piVar5 = (int *)INT_CMrealloc(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      p_Var2->out_links = piVar5;
      p_Var2->out_count = p_Var2->out_count + 1;
    }
    p_Var2->out_links[p_Var2->out_count + -1] = puVar10[5];
    bVar1 = false;
    for (local_9c = 0; local_9c < p_Var6->in_count; local_9c = local_9c + 1) {
      if (p_Var6->in_links[local_9c] == puVar10[1]) {
        bVar1 = true;
      }
    }
    if (!bVar1) {
      if (p_Var6->in_count == 0) {
        piVar5 = (int *)INT_CMmalloc((size_t)in_stack_fffffffffffffea0);
        p_Var6->in_links = piVar5;
        memset(p_Var6->in_links,0,4);
        p_Var6->in_count = 1;
      }
      else {
        piVar5 = (int *)INT_CMrealloc(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        p_Var6->in_links = piVar5;
        memset(p_Var6->in_links + p_Var6->in_count,0,
               (long)((p_Var6->in_count + 1) - p_Var6->in_count) << 2);
        p_Var6->in_count = p_Var6->in_count + 1;
      }
      p_Var6->in_links[p_Var6->in_count + -1] = puVar10[1];
    }
    if (in_ESI != 0) {
      act_08.node_for_action = in_stack_fffffffffffffeb8;
      act_08._0_8_ = *(undefined8 *)(puVar10 + 6);
      act_08._12_4_ = in_stack_fffffffffffffebc;
      act_08.u.bridge.action = (char *)puVar10;
      act_08.u._8_8_ = uVar8;
      EVdfg_add_act_to_queue(*(EVdfg_configuration *)(puVar10 + 2),act_08);
    }
    break;
  case 5:
    p_Var2 = find_stone_state(iVar9,in_RDI);
    if (p_Var2 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    if (p_Var2->out_count <= (int)puVar10[4]) {
      return 0;
    }
    if (p_Var2->out_links[(int)puVar10[4]] == -1) {
      return 0;
    }
    p_Var6 = find_stone_state(p_Var2->out_links[(int)puVar10[4]],in_RDI);
    if (p_Var6 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    if (p_Var6->bridge_stone != 0) {
      act_01.node_for_action = in_stack_00000008;
      act_01.type = (int)unaff_retaddr;
      act_01.stone_id = (int)((ulong)unaff_retaddr >> 0x20);
      act_01._12_20_ = in_stack_0000000c;
      EVdfg_perform_act_on_state((EVdfg_configuration)CONCAT44(in_ESI,iVar11),act_01,build_queue_00)
      ;
    }
    p_Var2->out_links[(int)puVar10[4]] = -1;
    if (in_ESI != 0) {
      act_09.node_for_action = in_stack_fffffffffffffeb8;
      act_09._0_8_ = *(undefined8 *)(puVar10 + 6);
      act_09._12_4_ = in_stack_fffffffffffffebc;
      act_09.u.bridge.action = (char *)puVar10;
      act_09.u._8_8_ = uVar8;
      EVdfg_add_act_to_queue(*(EVdfg_configuration *)(puVar10 + 2),act_09);
    }
    break;
  case 6:
    p_Var2 = find_stone_state(iVar9,in_RDI);
    p_Var6 = find_stone_state(puVar10[5],in_RDI);
    local_ec = 0;
    if (p_Var2 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    if (p_Var2->out_count <= (int)puVar10[4]) {
      return 0;
    }
    for (local_f0 = 0; local_f0 < p_Var2->out_count; local_f0 = local_f0 + 1) {
      if (p_Var2->out_links[local_f0] == p_Var6->stone_id) {
        memmove(p_Var2->out_links + local_f0,p_Var2->out_links + (local_f0 + 1),
                (long)((p_Var2->out_count - local_f0) + -1) << 2);
        local_ec = local_ec + 1;
      }
      else {
        p_Var7 = find_stone_state(p_Var2->out_links[local_f0],in_RDI);
        if ((p_Var7->bridge_stone != 0) && (*p_Var7->out_links == p_Var6->stone_id)) {
          act_02.node_for_action = in_stack_00000008;
          act_02.type = (int)unaff_retaddr;
          act_02.stone_id = (int)((ulong)unaff_retaddr >> 0x20);
          act_02._12_20_ = in_stack_0000000c;
          EVdfg_perform_act_on_state
                    ((EVdfg_configuration)CONCAT44(in_ESI,iVar11),act_02,
                     (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
          memmove(p_Var2->out_links + local_f0,p_Var2->out_links + (local_f0 + 1),
                  (long)((p_Var2->out_count - local_f0) + -1) << 2);
          local_ec = local_ec + 1;
          *puVar10 = 6;
          puVar10[4] = local_f0;
        }
      }
    }
    if (local_ec == 0) {
      return 0;
    }
    if (in_ESI != 0) {
      act_10.node_for_action = in_stack_fffffffffffffeb8;
      act_10._0_8_ = *(undefined8 *)(puVar10 + 6);
      act_10._12_4_ = in_stack_fffffffffffffebc;
      act_10.u.bridge.action = (char *)puVar10;
      act_10.u._8_8_ = uVar8;
      EVdfg_add_act_to_queue(*(EVdfg_configuration *)(puVar10 + 2),act_10);
    }
    break;
  case 7:
    p_Var2 = find_stone_state(iVar9,in_RDI);
    if (p_Var2 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    if (p_Var2->attrs != (attr_list)0x0) {
      free_attr_list(p_Var2->attrs);
    }
    p_Var2->attrs = *(attr_list *)(puVar10 + 4);
    if (in_ESI != 0) {
      act_11.node_for_action = in_stack_fffffffffffffeb8;
      act_11._0_8_ = *(undefined8 *)(puVar10 + 6);
      act_11._12_4_ = in_stack_fffffffffffffebc;
      act_11.u.bridge.action = (char *)puVar10;
      act_11.u._8_8_ = uVar8;
      EVdfg_add_act_to_queue(*(EVdfg_configuration *)(puVar10 + 2),act_11);
    }
    break;
  case 8:
    p_Var2 = find_stone_state(iVar9,in_RDI);
    if (p_Var2 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    if (in_ESI != 0) {
      act_13.node_for_action = in_stack_fffffffffffffeb8;
      act_13._0_8_ = *(undefined8 *)(puVar10 + 6);
      act_13._12_4_ = in_stack_fffffffffffffebc;
      act_13.u.bridge.action = (char *)puVar10;
      act_13.u._8_8_ = uVar8;
      EVdfg_add_act_to_queue(*(EVdfg_configuration *)(puVar10 + 2),act_13);
    }
    break;
  default:
    if ((in_stack_00000008 == 0) || (in_stack_00000008 == 10 || in_stack_00000008 == 0xb)) {
      printf("Bad action in perform_act_on_state %s (%d)\n",ACT_string[in_stack_00000008],
             (ulong)in_stack_00000008);
    }
    else {
      printf("Bad action in perform_act_on_state %d\n",(ulong)in_stack_00000008);
    }
    return 0;
  case 0xb:
    p_Var2 = find_stone_state(iVar9,in_RDI);
    if (p_Var2 == (EVdfg_stone_state)0x0) {
      return 0;
    }
    p_Var2->node = puVar10[4];
    if (in_ESI != 0) {
      act_12.node_for_action = in_stack_fffffffffffffeb8;
      act_12._0_8_ = *(undefined8 *)(puVar10 + 6);
      act_12._12_4_ = in_stack_fffffffffffffebc;
      act_12.u.bridge.action = (char *)puVar10;
      act_12.u._8_8_ = uVar8;
      EVdfg_add_act_to_queue(*(EVdfg_configuration *)(puVar10 + 2),act_12);
    }
    break;
  case 0xc:
    iVar11 = 1;
  case 0:
    p_Var2 = (EVdfg_stone_state)INT_CMmalloc((size_t)in_stack_fffffffffffffea0);
    p_Var2->node = -1;
    p_Var2->bridge_stone = 0;
    p_Var2->attrs = (attr_list)0x0;
    p_Var2->period_secs = -1;
    p_Var2->period_usecs = -1;
    p_Var2->out_count = 0;
    p_Var2->out_links = (int *)0x0;
    p_Var2->in_count = 0;
    p_Var2->in_links = (int *)0x0;
    p_Var2->action_count = 1;
    p_Var2->extra_actions = (char **)0x0;
    p_Var2->condition = EVstone_Undeployed;
    p_Var2->bridge_target = -1;
    p_Var2->fetched_events = (EVevent_list)0x0;
    if (iVar11 == 0) {
      p_Var2->stone_id = puVar10[1];
      p_Var2->action = *(char **)(puVar10 + 4);
    }
    else {
      p_Var2->bridge_stone = 1;
      p_Var2->stone_id = puVar10[1];
      p_Var2->action = *(char **)(puVar10 + 4);
      p_Var2->bridge_target = puVar10[6];
      p_Var2->node = puVar10[2];
    }
    if (in_RDI->stone_count == 0) {
      pp_Var3 = (EVdfg_stone_state *)INT_CMmalloc((size_t)in_stack_fffffffffffffea0);
      in_RDI->stones = pp_Var3;
    }
    else {
      pp_Var3 = (EVdfg_stone_state *)
                INT_CMrealloc(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
      in_RDI->stones = pp_Var3;
    }
    iVar9 = in_RDI->stone_count;
    in_RDI->stone_count = iVar9 + 1;
    in_RDI->stones[iVar9] = p_Var2;
    if (in_ESI != 0) {
      act_03.node_for_action = in_stack_fffffffffffffeb8;
      act_03._0_8_ = *(undefined8 *)(puVar10 + 6);
      act_03._12_4_ = in_stack_fffffffffffffebc;
      act_03.u.bridge.action = (char *)puVar10;
      act_03.u._8_8_ = uVar8;
      EVdfg_add_act_to_queue(*(EVdfg_configuration *)(puVar10 + 2),act_03);
    }
  }
  return 1;
}

Assistant:

int
EVdfg_perform_act_on_state(EVdfg_configuration config, EVdfg_config_action act, int build_queue)
{
    int bridge = 0;
    switch(act.type) {
    case ACT_create_bridge:
	bridge = 1;
	/* falling through */
    case ACT_create: {
	EVdfg_stone_state stone = malloc(sizeof(*stone));
	stone->node = -1;
	stone->bridge_stone = 0;
	stone->attrs = NULL;
	stone->period_secs = -1;
	stone->period_usecs = -1;
	stone->out_count = 0;
	stone->out_links = NULL;
	stone->in_count = 0;
	stone->in_links = NULL;
	stone->action_count = 1;
	stone->extra_actions = NULL;
	stone->condition = EVstone_Undeployed;
	stone->bridge_target = -1;
	stone->fetched_events = NULL;
	if (bridge) {
	    stone->bridge_stone = 1;
	    stone->stone_id = act.stone_id;
	    stone->action = act.u.bridge.action;
	    stone->bridge_target = act.u.bridge.target_id;
	    stone->node = act.node_for_action;
	} else {
	    stone->stone_id = act.stone_id;
	    stone->action = act.u.create.action;
	}
	if (config->stone_count == 0) {
	    config->stones = malloc(sizeof(config->stones[0]));
	} else {
	    config->stones = realloc(config->stones, 
				     sizeof(config->stones[0]) * (config->stone_count + 1));
	}
	config->stones[config->stone_count++] = stone;
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_add_action: {
	EVdfg_stone_state stone = find_stone_state(act.stone_id, config);
	if (!stone) {
	    return 0;
	}
	if (stone->action == NULL) {
	    stone->action = act.u.create.action;
	    break;
	}
	if (stone->extra_actions == NULL) {
	    stone->extra_actions = malloc(sizeof(stone->extra_actions[0]));
	} else {
	    stone->extra_actions = realloc(stone->extra_actions,
					   stone->action_count * sizeof(stone->extra_actions[0]));
	}
	stone->extra_actions[stone->action_count - 1] = act.u.create.action;
	stone->action_count++;
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_set_auto_period: {
	EVdfg_stone_state stone = find_stone_state(act.stone_id, config);
	if (!stone) {
	    return 0;
	}
	stone->period_secs = act.u.period.secs;
	stone->period_usecs = act.u.period.usecs;
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_link_port: {
	EVdfg_stone_state src = find_stone_state(act.stone_id, config);
	EVdfg_stone_state dst = find_stone_state(act.u.link.dest_id, config);
	int i, in_link_found;
	if (!src) {
	    return 0;
	}
	if (src->out_count == 0) {
	    src->out_links = malloc(sizeof(src->out_links[0]) * (act.u.link.port+1));
	    memset(src->out_links, 0, sizeof(src->out_links[0]) * (act.u.link.port+1));
	    src->out_count = act.u.link.port + 1;
	} else if (src->out_count < act.u.link.port + 1) {
	    src->out_links = realloc(src->out_links,
				     sizeof(src->out_links[0]) * (act.u.link.port+1));
	    memset(&src->out_links[src->out_count], -1, sizeof(src->out_links[0]) * (act.u.link.port+1-src->out_count));
	    src->out_count = act.u.link.port + 1;
	}
	in_link_found =  0;
	for (i=0; i < dst->in_count; i++) {
	    if (dst->in_links[i] == act.stone_id) in_link_found = 1;
	}
	if (in_link_found == 0) {
	    if (dst->in_count == 0) {
		dst->in_links = malloc(sizeof(dst->in_links[0]));
		memset(dst->in_links, 0, sizeof(dst->in_links[0]));
		dst->in_count = 1;
	    } else {
		dst->in_links = realloc(dst->in_links,
					sizeof(dst->in_links[0]) * (dst->in_count+1));
		memset(&dst->in_links[dst->in_count], 0, sizeof(dst->in_links[0]) * (dst->in_count+1-dst->in_count));
		dst->in_count++;
	    }
	    dst->in_links[dst->in_count - 1] = act.stone_id;
	}
	if (build_queue) {
	    if (src->out_links[act.u.link.port] != -1) {
		EVdfg_config_action dact;
		dact.type = ACT_unlink_port;
		dact.node_for_action = src->node;
		dact.stone_id = src->stone_id;
		dact.u.link.port = act.u.link.port;
		EVdfg_perform_act_on_state(config, dact, build_queue);
	    }
	}
	src->out_links[act.u.link.port] = act.u.link.dest_id;
	if (build_queue) {
	    if (src->condition == EVstone_Deployed) {
		EVdfg_config_action fact;
		fact.type = ACT_freeze;
		fact.stone_id = src->stone_id;
		fact.node_for_action = src->node;
		EVdfg_add_act_to_queue(config, fact);
		src->condition = EVstone_Frozen;
	    }
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_link_dest: {
	EVdfg_stone_state src = find_stone_state(act.stone_id, config);
	EVdfg_stone_state dst = find_stone_state(act.u.link.dest_id, config);
	int i, in_link_found, out_link_found =  0;
	for (i=0; i < src->out_count; i++) {
	    if (src->out_links[i] == act.u.link.dest_id) out_link_found = 1;
	}
	if (out_link_found) {
	    return 0;
	}
	if (!src) {
	    return 0;
	}
	if (src->out_count == 0) {
	    src->out_links = malloc(sizeof(src->out_links[0]) * (src->out_count+1));
	    memset(src->out_links, 0, sizeof(src->out_links[0]) * (src->out_count+1));
	    src->out_count++;
	} else {
	    src->out_links = realloc(src->out_links,
				     sizeof(src->out_links[0]) * (src->out_count+1));
	    src->out_count++;
	}
	src->out_links[src->out_count-1] = act.u.link.dest_id;
	in_link_found = 0;
	for (i=0; i < dst->in_count; i++) {
	    if (dst->in_links[i] == act.stone_id) in_link_found = 1;
	}
	if (in_link_found == 0) {
	    if (dst->in_count == 0) {
		dst->in_links = malloc(sizeof(dst->in_links[0]));
		memset(dst->in_links, 0, sizeof(dst->in_links[0]));
		dst->in_count = 1;
	    } else {
		dst->in_links = realloc(dst->in_links,
					sizeof(dst->in_links[0]) * (dst->in_count+1));
		memset(&dst->in_links[dst->in_count], 0, sizeof(dst->in_links[0]) * (dst->in_count+1-dst->in_count));
		dst->in_count++;
	    }
	    dst->in_links[dst->in_count - 1] = act.stone_id;
	}
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_unlink_port: {
	EVdfg_stone_state src = find_stone_state(act.stone_id, config);
	EVdfg_stone_state dest;
	if (!src) {
	    return 0;
	}
	if (src->out_count <= act.u.link.port) return 0;
	if (src->out_links[act.u.link.port] == -1) {
	    /* unassigned, error to unlink */
	    return 0;
	}
	dest = find_stone_state(src->out_links[act.u.link.port], config);
	if (!dest) {
	    return 0;
	}
	if (dest->bridge_stone) {
	    /* this stone only exists because of this link, destroy it */
	    EVdfg_config_action dact;
	    dact.type = ACT_destroy;
	    dact.stone_id = dest->stone_id;
	    EVdfg_perform_act_on_state(config, dact, build_queue);
	}
	src->out_links[act.u.link.port] = -1;
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_unlink_dest: {
	EVdfg_stone_state src = find_stone_state(act.stone_id, config);
	EVdfg_stone_state dest = find_stone_state(act.u.link.dest_id, config);
	int found = 0;
	int i = 0;
	if (!src) {
	    return 0;
	}
	if (src->out_count <= act.u.link.port) return 0;
	for (i=0; i < src->out_count; i++) {
	    if (src->out_links[i] == dest->stone_id) {
		/* remove this, move remaining down */
		memmove(&src->out_links[i], &src->out_links[i+1], 
			sizeof(src->out_links[0]) * (src->out_count - i - 1));
		found++;
	    } else {
		EVdfg_stone_state possible_bridge = find_stone_state(src->out_links[i], config);
		if (possible_bridge->bridge_stone && (possible_bridge->out_links[0] == dest->stone_id)) {
		    /* there was a bridge stone in between, but we found the link */
		    /* the bridge stone only exists because of this link, destroy it */
		    EVdfg_config_action dact;
		    dact.type = ACT_destroy;
		    dact.stone_id = possible_bridge->stone_id;
		    EVdfg_perform_act_on_state(config, dact, build_queue);
		    /* remove this link, move remaining down */
		    memmove(&src->out_links[i], &src->out_links[i+1], 
			    sizeof(src->out_links[0]) * (src->out_count - i - 1));
		    found++;
		    /* rewrite action to refer to link by position */
		    act.type = ACT_unlink_port;
		    act.u.link.port = i;
		}
	    }
	}
	if (found == 0) {
	    /* not found, error to unlink */
	    return 0;
	} 
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_set_attrs: {
	EVdfg_stone_state stone = find_stone_state(act.stone_id, config);
	if (!stone) {
	    return 0;
	}
	if (stone->attrs != NULL) {
	    free_attr_list(stone->attrs);
	}
	stone->attrs = act.u.attrs.attrs;
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_assign_node: {
	EVdfg_stone_state stone = find_stone_state(act.stone_id, config);
	if (!stone) {
	    return 0;
	}
	stone->node = act.u.assign.dest_node;
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    case ACT_destroy: {
	EVdfg_stone_state stone = find_stone_state(act.stone_id, config);
	if (!stone) {
	    return 0;
	}
	if (build_queue) {
	    EVdfg_add_act_to_queue(config, act);
	}
	break;
    }
    default:
	switch(act.type) {
	case ACT_no_op:
	case ACT_freeze:
	case ACT_unfreeze:
	    printf("Bad action in perform_act_on_state %s (%d)\n", ACT_string[act.type], act.type);
	    break;
	default:
	    printf("Bad action in perform_act_on_state %d\n", act.type);
	    break;
	}
	return 0;
    }
    return 1;
}